

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O2

string * __thiscall wabt::Token::to_string_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  TokenType TVar1;
  char *pcVar2;
  allocator *paVar3;
  string_view *this_00;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  TVar1 = this->token_type_;
  if ((ulong)TVar1 < 0x2f) {
    pcVar2 = GetTokenTypeName::s_names[TVar1];
    paVar3 = &local_9;
  }
  else {
    if (TVar1 - First_Literal < 3) {
      this_00 = &(this->field_2).literal_.text;
LAB_001de500:
      string_view::to_string_abi_cxx11_(__return_storage_ptr__,this_00);
      return __return_storage_ptr__;
    }
    if (TVar1 - AtomicLoad < 0x3e) {
      pcVar2 = Opcode::GetName(&(this->field_2).opcode_);
      paVar3 = &local_a;
    }
    else {
      if (TVar1 - AlignEqNat < 6) {
        this_00 = (string_view *)&this->field_2;
        goto LAB_001de500;
      }
      if (TVar1 != First_Type) {
        __assert_fail("HasType()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/token.cc"
                      ,0x53,"std::string wabt::Token::to_string() const");
      }
      pcVar2 = Type::GetName(&(this->field_2).type_);
      paVar3 = &local_b;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string Token::to_string() const {
  if (IsTokenTypeBare(token_type_)) {
    return GetTokenTypeName(token_type_);
  } else if (HasLiteral()) {
    return literal_.text.to_string();
  } else if (HasOpcode()) {
    return opcode_.GetName();
  } else if (HasText()) {
    return text_.to_string();
  } else {
    assert(HasType());
    return type_.GetName();
  }
}